

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

bool __thiscall woff2::Buffer::Read(Buffer *this,uint8_t *data,size_t n_bytes)

{
  size_t n_bytes_local;
  uint8_t *data_local;
  Buffer *this_local;
  
  if (n_bytes < 0x40000001) {
    if ((this->length_ < this->offset_ + n_bytes) || (this->length_ - n_bytes < this->offset_)) {
      this_local._7_1_ = false;
    }
    else {
      if (data != (uint8_t *)0x0) {
        memcpy(data,this->buffer_ + this->offset_,n_bytes);
      }
      this->offset_ = n_bytes + this->offset_;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(uint8_t *data, size_t n_bytes) {
    if (n_bytes > 1024 * 1024 * 1024) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((offset_ + n_bytes > length_) ||
        (offset_ > length_ - n_bytes)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (data) {
      std::memcpy(data, buffer_ + offset_, n_bytes);
    }
    offset_ += n_bytes;
    return true;
  }